

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O1

void project_feature_handler_MAKE_TRAP(project_feature_handler_context_t *context)

{
  loc grid;
  _Bool _Var1;
  uint32_t uVar2;
  
  grid = context->grid;
  _Var1 = square_isempty(cave,grid);
  if (_Var1) {
    _Var1 = square_istrap(cave,grid);
    if (!_Var1) {
      uVar2 = Rand_div(4);
      if (uVar2 == 0) {
        square_add_trap(cave,grid);
        square_reveal_trap((chunk *)cave,grid,false,false);
      }
      context->obvious = true;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_MAKE_TRAP(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Require an "empty" floor grid with no existing traps or glyphs */
	if (!square_isempty(cave, grid)) return;
	if (square_istrap(cave, grid)) return;

	/* Create a trap, try to notice it */
	if (one_in_(4)) {
		square_add_trap(cave, grid);
		(void) square_reveal_trap(cave, grid, false, false);
	}
	context->obvious = true;
}